

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSObjectFactory::buildChoiceSequenceParticles
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSParticleList *particleList,
          XSModel *xsModel)

{
  NodeTypes NVar1;
  ContentSpecNode *pCVar2;
  XSParticle *pXVar3;
  XSParticle *xsParticle;
  XSParticle *elemParticle;
  XSParticle *wildcardParticle;
  NodeTypes nodeType;
  XSModel *xsModel_local;
  XSParticleList *particleList_local;
  ContentSpecNode *rootNode_local;
  XSObjectFactory *this_local;
  
  if (rootNode != (ContentSpecNode *)0x0) {
    NVar1 = ContentSpecNode::getType(rootNode);
    if (NVar1 == Sequence) {
      pCVar2 = ContentSpecNode::getFirst(rootNode);
      buildChoiceSequenceParticles(this,pCVar2,particleList,xsModel);
      pCVar2 = ContentSpecNode::getSecond(rootNode);
      buildChoiceSequenceParticles(this,pCVar2,particleList,xsModel);
    }
    else if (NVar1 == Choice) {
      pCVar2 = ContentSpecNode::getFirst(rootNode);
      buildChoiceSequenceParticles(this,pCVar2,particleList,xsModel);
      pCVar2 = ContentSpecNode::getSecond(rootNode);
      buildChoiceSequenceParticles(this,pCVar2,particleList,xsModel);
    }
    else if (((((NVar1 & (Any_NS|Any_Other)) == Any) || ((NVar1 & (Any_NS|Any_Other)) == Any_Other))
             || ((NVar1 & (Any_NS|Any_Other)) == Any_NS)) || (NVar1 == Any_NS_Choice)) {
      pXVar3 = createWildcardParticle(this,rootNode,xsModel);
      if (pXVar3 != (XSParticle *)0x0) {
        BaseRefVectorOf<xercesc_4_0::XSParticle>::addElement
                  (&particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>,pXVar3);
      }
    }
    else if (NVar1 == Leaf) {
      pXVar3 = createElementParticle(this,rootNode,xsModel);
      if (pXVar3 != (XSParticle *)0x0) {
        BaseRefVectorOf<xercesc_4_0::XSParticle>::addElement
                  (&particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>,pXVar3);
      }
    }
    else {
      pXVar3 = createModelGroupParticle(this,rootNode,xsModel);
      if (pXVar3 != (XSParticle *)0x0) {
        BaseRefVectorOf<xercesc_4_0::XSParticle>::addElement
                  (&particleList->super_BaseRefVectorOf<xercesc_4_0::XSParticle>,pXVar3);
      }
    }
  }
  return;
}

Assistant:

void XSObjectFactory::buildChoiceSequenceParticles(const ContentSpecNode* const rootNode,
                                            XSParticleList* const particleList,
                                            XSModel* const xsModel)
{
    if (rootNode)
    {
        const ContentSpecNode::NodeTypes nodeType = rootNode->getType();

        if (nodeType == ContentSpecNode::Sequence)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if (nodeType == ContentSpecNode::Choice)
        {
            buildChoiceSequenceParticles(rootNode->getFirst(), particleList, xsModel);
            buildChoiceSequenceParticles(rootNode->getSecond(), particleList, xsModel);
        }
        else if ((nodeType & 0x0f) == ContentSpecNode::Any
                 || (nodeType & 0x0f) == ContentSpecNode::Any_Other
                 || (nodeType & 0x0f) == ContentSpecNode::Any_NS
                 || nodeType == ContentSpecNode::Any_NS_Choice)
        {
            XSParticle* wildcardParticle = createWildcardParticle(rootNode, xsModel);
            if (wildcardParticle)
                particleList->addElement(wildcardParticle);
        }
        else if (nodeType == ContentSpecNode::Leaf)
        {
            XSParticle* elemParticle = createElementParticle(rootNode, xsModel);
            if (elemParticle)
                particleList->addElement(elemParticle);
        }
        // must be a model group
        else
        {
            XSParticle* xsParticle = createModelGroupParticle(rootNode, xsModel);
            if (xsParticle)
                particleList->addElement(xsParticle);
        }
    }
}